

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

void __thiscall spirv_cross::Compiler::register_write(Compiler *this,uint32_t chain)

{
  Parameter *pPVar1;
  bool bVar2;
  uint32_t uVar3;
  SPIRVariable *var;
  SPIRExpression *pSVar4;
  SPIRAccessChain *pSVar5;
  ulong uVar6;
  SPIRType *pSVar7;
  SPIRType *pSVar8;
  ulong uVar9;
  Variant *pVVar10;
  ulong uVar11;
  bool bVar12;
  
  uVar11 = (ulong)chain;
  uVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
  if (uVar6 <= uVar11) goto LAB_00330674;
  pVVar10 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
  if (pVVar10[uVar11].type == TypeVariable) {
    pVVar10 = pVVar10 + uVar11;
  }
  else {
    pVVar10 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr;
    if (pVVar10[uVar11].type == TypeExpression) {
      pSVar4 = Variant::get<spirv_cross::SPIRExpression>(pVVar10 + uVar11);
      uVar9 = (ulong)(pSVar4->loaded_from).id;
      uVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
      if (((uVar9 == 0) || (uVar6 <= uVar9)) ||
         (pVVar10 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
         pVVar10[uVar9].type != TypeVariable)) goto LAB_00330674;
      var = Variant::get<spirv_cross::SPIRVariable>(pVVar10 + uVar9);
      uVar6 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size;
    }
    else {
LAB_00330674:
      var = (SPIRVariable *)0x0;
    }
    if ((uVar6 <= uVar11) ||
       (pVVar10 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar10[uVar11].type != TypeAccessChain)) goto LAB_003306bd;
    pSVar5 = Variant::get<spirv_cross::SPIRAccessChain>(pVVar10 + uVar11);
    uVar6 = (ulong)(pSVar5->loaded_from).id;
    if (uVar6 == 0) goto LAB_003306bd;
    if (((this->ir).ids.super_VectorView<spirv_cross::Variant>.buffer_size <= uVar6) ||
       (pVVar10 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr,
       pVVar10[uVar6].type != TypeVariable)) {
      var = (SPIRVariable *)0x0;
      goto LAB_003306bd;
    }
    pVVar10 = pVVar10 + uVar6;
  }
  var = Variant::get<spirv_cross::SPIRVariable>(pVVar10);
LAB_003306bd:
  uVar3 = expression_type_id(this,chain);
  pSVar7 = Variant::get<spirv_cross::SPIRType>
                     ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar3);
  if (var != (SPIRVariable *)0x0) {
    uVar3 = expression_type_id(this,chain);
    pSVar7 = Variant::get<spirv_cross::SPIRType>
                       ((this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar3);
    pSVar8 = get_variable_data_type(this,var);
    bVar12 = true;
    if (pSVar8->pointer == true) {
      flush_all_active_variables(this);
      bVar12 = pSVar7->pointer_depth != 1;
    }
    if ((pSVar7->storage == StorageClassPhysicalStorageBuffer) ||
       (bVar2 = variable_storage_is_aliased(this,var), bVar2)) {
      flush_all_aliased_variables(this);
    }
    else {
      flush_dependees(this,var);
    }
    if (((bVar12) && (pPVar1 = var->parameter, pPVar1 != (Parameter *)0x0)) &&
       (pPVar1->write_count == 0)) {
      pPVar1->write_count = 1;
      this->is_force_recompile = true;
    }
    return;
  }
  if (pSVar7->pointer != true) {
    return;
  }
  flush_all_active_variables(this);
  return;
}

Assistant:

void Compiler::register_write(uint32_t chain)
{
	auto *var = maybe_get<SPIRVariable>(chain);
	if (!var)
	{
		// If we're storing through an access chain, invalidate the backing variable instead.
		auto *expr = maybe_get<SPIRExpression>(chain);
		if (expr && expr->loaded_from)
			var = maybe_get<SPIRVariable>(expr->loaded_from);

		auto *access_chain = maybe_get<SPIRAccessChain>(chain);
		if (access_chain && access_chain->loaded_from)
			var = maybe_get<SPIRVariable>(access_chain->loaded_from);
	}

	auto &chain_type = expression_type(chain);

	if (var)
	{
		bool check_argument_storage_qualifier = true;
		auto &type = expression_type(chain);

		// If our variable is in a storage class which can alias with other buffers,
		// invalidate all variables which depend on aliased variables. And if this is a
		// variable pointer, then invalidate all variables regardless.
		if (get_variable_data_type(*var).pointer)
		{
			flush_all_active_variables();

			if (type.pointer_depth == 1)
			{
				// We have a backing variable which is a pointer-to-pointer type.
				// We are storing some data through a pointer acquired through that variable,
				// but we are not writing to the value of the variable itself,
				// i.e., we are not modifying the pointer directly.
				// If we are storing a non-pointer type (pointer_depth == 1),
				// we know that we are storing some unrelated data.
				// A case here would be
				// void foo(Foo * const *arg) {
				//   Foo *bar = *arg;
				//   bar->unrelated = 42;
				// }
				// arg, the argument is constant.
				check_argument_storage_qualifier = false;
			}
		}

		if (type.storage == StorageClassPhysicalStorageBufferEXT || variable_storage_is_aliased(*var))
			flush_all_aliased_variables();
		else if (var)
			flush_dependees(*var);

		// We tried to write to a parameter which is not marked with out qualifier, force a recompile.
		if (check_argument_storage_qualifier && var->parameter && var->parameter->write_count == 0)
		{
			var->parameter->write_count++;
			force_recompile();
		}
	}
	else if (chain_type.pointer)
	{
		// If we stored through a variable pointer, then we don't know which
		// variable we stored to. So *all* expressions after this point need to
		// be invalidated.
		// FIXME: If we can prove that the variable pointer will point to
		// only certain variables, we can invalidate only those.
		flush_all_active_variables();
	}

	// If chain_type.pointer is false, we're not writing to memory backed variables, but temporaries instead.
	// This can happen in copy_logical_type where we unroll complex reads and writes to temporaries.
}